

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::EnumGenerator::GenerateSource
          (EnumGenerator *this,Printer *printer)

{
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  undefined4 key;
  pointer ppVar1;
  bool bVar2;
  reference ppEVar3;
  size_t sVar4;
  undefined8 in_RCX;
  EnumValueDescriptor *descriptor;
  undefined1 auVar5 [16];
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var6;
  string_view sVar7;
  Sub *local_8c8;
  basic_string_view<char,_std::char_traits<char>_> local_800;
  basic_string_view<char,_std::char_traits<char>_> local_7e8;
  undefined1 local_7d1;
  anon_class_16_2_bb68eac7_for_cb local_7d0;
  allocator<char> local_7b9;
  string local_7b8;
  char *local_798;
  allocator<char> local_789;
  string local_788;
  char *local_768;
  allocator<char> local_759;
  string local_758;
  anon_class_16_2_f589233e_for_cb local_738;
  allocator<char> local_721;
  string local_720;
  anon_class_16_2_bb68eac7_for_cb local_700;
  allocator<char> local_6e9;
  string local_6e8;
  anon_class_16_2_320ed6b4_for_cb local_6c8;
  allocator<char> local_6b1;
  string local_6b0;
  allocator<char> local_689;
  string local_688;
  Sub *local_668;
  Sub local_660;
  Sub local_5a8;
  Sub local_4f0;
  Sub local_438;
  Sub local_380;
  Sub local_2c8;
  Sub local_210;
  iterator local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_148;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  local_138;
  string_view local_118;
  undefined1 local_108 [16];
  string local_f8;
  undefined8 local_d8;
  undefined8 local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_98 [8];
  string short_name;
  EnumValueDescriptor *v;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  *__range3;
  string text_blob;
  undefined1 local_30 [4];
  int enum_value_description_key;
  TextFormatDecodeData text_format_decode_data;
  Printer *printer_local;
  EnumGenerator *this_local;
  
  text_format_decode_data.entries_.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)printer;
  TextFormatDecodeData::TextFormatDecodeData((TextFormatDecodeData *)local_30);
  text_blob.field_2._12_4_ = 0xffffffff;
  std::__cxx11::string::string((string *)&__range3);
  __end3 = std::
           vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
           ::begin(&this->all_values_);
  v = (EnumValueDescriptor *)
      std::
      vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ::end(&this->all_values_);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_google::protobuf::EnumValueDescriptor_*const_*,_std::vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>_>
                                *)&v);
    ppVar1 = text_format_decode_data.entries_.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (!bVar2) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::EnumValueDescriptor_*const_*,_std::vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>_>
              ::operator*(&__end3);
    short_name.field_2._8_8_ = *ppEVar3;
    text_blob.field_2._12_4_ = text_blob.field_2._12_4_ + 1;
    EnumValueShortName_abi_cxx11_
              ((string *)local_98,(objectivec *)short_name.field_2._8_8_,descriptor);
    std::operator+(&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   '\0');
    std::__cxx11::string::operator+=((string *)&__range3,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
    sVar7._M_len = auVar5._8_8_;
    sVar7._M_str = (char *)in_RCX;
    local_108 = auVar5;
    UnCamelCaseEnumShortName_abi_cxx11_(&local_f8,auVar5._0_8_,sVar7);
    _Var6 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_f8);
    _local_d8 = (undefined1  [16])_Var6;
    sVar7 = EnumValueDescriptor::name((EnumValueDescriptor *)short_name.field_2._8_8_);
    in_RCX = sVar7._M_str;
    local_118 = sVar7;
    bVar2 = std::operator!=((__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                            _local_d8,sVar7);
    std::__cxx11::string::~string((string *)&local_f8);
    key = text_blob.field_2._12_4_;
    if (bVar2) {
      sVar7 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
      local_138._16_16_ = (undefined1  [16])sVar7;
      sVar7 = EnumValueDescriptor::name((EnumValueDescriptor *)short_name.field_2._8_8_);
      in_RCX = local_138._24_8_;
      local_138._0_16_ = (undefined1  [16])sVar7;
      TextFormatDecodeData::AddString
                ((TextFormatDecodeData *)local_30,key,(string_view)local_138._16_16_,sVar7);
    }
    std::__cxx11::string::~string((string *)local_98);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::EnumValueDescriptor_*const_*,_std::vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>_>
    ::operator++(&__end3);
  }
  local_7d1 = 1;
  local_668 = &local_660;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"name",&local_689);
  io::Printer::Sub::Sub<std::__cxx11::string_const&>(&local_660,&local_688,&this->name_);
  local_668 = &local_5a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"values_name_blob",&local_6b1);
  local_6c8.text_blob = (string *)&__range3;
  local_6c8.printer =
       (Printer **)
       &text_format_decode_data.entries_.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::objectivec::EnumGenerator::GenerateSource(google::protobuf::io::Printer*)const::__0>
            (&local_5a8,&local_6b0,&local_6c8);
  local_668 = &local_4f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,"values",&local_6e9);
  local_700.printer =
       (Printer **)
       &text_format_decode_data.entries_.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_700.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::objectivec::EnumGenerator::GenerateSource(google::protobuf::io::Printer*)const::__1>
            (&local_4f0,&local_6e8,&local_700);
  local_668 = &local_438;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"maybe_extra_text_format_decl",&local_721);
  local_738.text_format_decode_data = (TextFormatDecodeData *)local_30;
  local_738.printer =
       (Printer **)
       &text_format_decode_data.entries_.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::objectivec::EnumGenerator::GenerateSource(google::protobuf::io::Printer*)const::__2>
            (&local_438,&local_720,&local_738);
  local_668 = &local_380;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,"maybe_extraTextFormatInfo",&local_759);
  sVar4 = TextFormatDecodeData::num_entries((TextFormatDecodeData *)local_30);
  local_768 = "\n                              extraTextFormatInfo:extraTextFormatInfo";
  if (sVar4 == 0) {
    local_768 = "";
  }
  io::Printer::Sub::Sub<char_const*>(&local_380,&local_758,&local_768);
  local_668 = &local_2c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_788,"enum_flags",&local_789);
  bVar2 = EnumDescriptor::is_closed(this->descriptor_);
  local_798 = "GPBEnumDescriptorInitializationFlag_None";
  if (bVar2) {
    local_798 = "GPBEnumDescriptorInitializationFlag_IsClosed";
  }
  io::Printer::Sub::Sub<char_const*>(&local_2c8,&local_788,&local_798);
  local_668 = &local_210;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"enum_cases",&local_7b9);
  local_7d0.printer =
       (Printer **)
       &text_format_decode_data.entries_.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_7d0.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::objectivec::EnumGenerator::GenerateSource(google::protobuf::io::Printer*)const::__3>
            (&local_210,&local_7b8,&local_7d0);
  local_7d1 = 0;
  local_158 = &local_660;
  local_150 = 7;
  v_00._M_len = 7;
  v_00._M_array = local_158;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_148._M_local_buf,v_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_7e8,
             "\n        #pragma mark - Enum $name$\n\n        GPBEnumDescriptor *$name$_EnumDescriptor(void) {\n          static _Atomic(GPBEnumDescriptor*) descriptor = nil;\n          if (!descriptor) {\n            static const char *valueNames =\n                $values_name_blob$\n            static const int32_t values[] = {\n                $values$\n            };\n            $maybe_extra_text_format_decl$\n            GPBEnumDescriptor *worker =\n                [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)\n                                           runtimeSupport:&$google_protobuf_runtime_support$\n                                               valueNames:valueNames\n                                                   values:values\n                                                    count:(uint32_t)(sizeof(values) / sizeof(int32_t))\n                                             enumVerifier:$name$_IsValidValue\n                                                    flags:$enum_flags$$maybe_extraTextFormatInfo$];\n            GPBEnumDescriptor *expected = nil;\n            if (!atomic_compare_exchange_strong(&descriptor, &expected, worker)) {\n              [worker release];\n            }\n          }\n          return descriptor;\n        }\n\n        BOOL $name$_IsValidValue(int32_t value__) {\n          switch (value__) {\n            $enum_cases$\n              return YES;\n            default:\n              return NO;\n          }\n        }\n      "
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)ppVar1,local_148._M_allocated_capacity,local_148._8_8_,
                    local_7e8._M_len,local_7e8._M_str);
  local_8c8 = (Sub *)&local_158;
  do {
    local_8c8 = local_8c8 + -1;
    io::Printer::Sub::~Sub(local_8c8);
  } while (local_8c8 != &local_660);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  std::__cxx11::string::~string((string *)&local_788);
  std::allocator<char>::~allocator(&local_789);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator(&local_759);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator(&local_6e9);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator(&local_6b1);
  std::__cxx11::string::~string((string *)&local_688);
  std::allocator<char>::~allocator(&local_689);
  ppVar1 = text_format_decode_data.entries_.
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_800,"\n");
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)ppVar1,local_800._M_len,local_800._M_str);
  std::__cxx11::string::~string((string *)&__range3);
  TextFormatDecodeData::~TextFormatDecodeData((TextFormatDecodeData *)local_30);
  return;
}

Assistant:

void EnumGenerator::GenerateSource(io::Printer* printer) const {
  // Note: For the TextFormat decode info, we can't use the enum value as
  // the key because protocol buffer enums have 'allow_alias', which lets
  // a value be used more than once. Instead, the index into the list of
  // enum value descriptions is used. Note: start with -1 so the first one
  // will be zero.
  TextFormatDecodeData text_format_decode_data;
  int enum_value_description_key = -1;
  std::string text_blob;

  for (const auto* v : all_values_) {
    ++enum_value_description_key;
    std::string short_name(EnumValueShortName(v));
    text_blob += short_name + '\0';
    if (UnCamelCaseEnumShortName(short_name) != v->name()) {
      text_format_decode_data.AddString(enum_value_description_key, short_name,
                                        v->name());
    }
  }

  printer->Emit(
      {{"name", name_},
       {"values_name_blob",
        [&] {
          static const int kBytesPerLine = 40;  // allow for escaping
          for (size_t i = 0; i < text_blob.size(); i += kBytesPerLine) {
            printer->Emit({{"data", EscapeTrigraphs(absl::CEscape(
                                        text_blob.substr(i, kBytesPerLine)))},
                           {"ending_semi",
                            (i + kBytesPerLine) < text_blob.size() ? "" : ";"}},
                          R"objc(
                            "$data$"$ending_semi$
                          )objc");
          }
        }},
       {"values",
        [&] {
          for (const auto* v : all_values_) {
            printer->Emit({{"value_name", EnumValueName(v)}},
                          R"objc(
                            $value_name$,
                          )objc");
          }
        }},
       {"maybe_extra_text_format_decl",
        [&] {
          if (text_format_decode_data.num_entries()) {
            printer->Emit({{"extraTextFormatInfo",
                            absl::CEscape(text_format_decode_data.Data())}},
                          R"objc(
                            static const char *extraTextFormatInfo = "$extraTextFormatInfo$";
                          )objc");
          }
        }},
       {"maybe_extraTextFormatInfo",
        // Could not find a better way to get this extra line inserted and
        // correctly formatted.
        (text_format_decode_data.num_entries() == 0
             ? ""
             : "\n                              "
               "extraTextFormatInfo:extraTextFormatInfo")},
       {"enum_flags", descriptor_->is_closed()
                          ? "GPBEnumDescriptorInitializationFlag_IsClosed"
                          : "GPBEnumDescriptorInitializationFlag_None"},
       {"enum_cases",
        [&] {
          for (const auto* v : base_values_) {
            printer->Emit({{"case_name", EnumValueName(v)}},
                          R"objc(
                            case $case_name$:
                          )objc");
          }
        }}},
      R"objc(
        #pragma mark - Enum $name$

        GPBEnumDescriptor *$name$_EnumDescriptor(void) {
          static _Atomic(GPBEnumDescriptor*) descriptor = nil;
          if (!descriptor) {
            static const char *valueNames =
                $values_name_blob$
            static const int32_t values[] = {
                $values$
            };
            $maybe_extra_text_format_decl$
            GPBEnumDescriptor *worker =
                [GPBEnumDescriptor allocDescriptorForName:GPBNSStringifySymbol($name$)
                                           runtimeSupport:&$google_protobuf_runtime_support$
                                               valueNames:valueNames
                                                   values:values
                                                    count:(uint32_t)(sizeof(values) / sizeof(int32_t))
                                             enumVerifier:$name$_IsValidValue
                                                    flags:$enum_flags$$maybe_extraTextFormatInfo$];
            GPBEnumDescriptor *expected = nil;
            if (!atomic_compare_exchange_strong(&descriptor, &expected, worker)) {
              [worker release];
            }
          }
          return descriptor;
        }

        BOOL $name$_IsValidValue(int32_t value__) {
          switch (value__) {
            $enum_cases$
              return YES;
            default:
              return NO;
          }
        }
      )objc");
  printer->Emit("\n");
}